

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void rtreeCheckNode(RtreeCheck *pCheck,int iDepth,u8 *aParent,i64 iNode)

{
  RtreeCoord RVar1;
  RtreeCoord RVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  void *__src;
  ushort *__dest;
  sqlite3_stmt *pStmt;
  i64 iKey;
  int iVar6;
  ulong uVar7;
  u8 *p;
  long lVar8;
  u8 *p_00;
  ulong uVar9;
  long in_FS_OFFSET;
  RtreeCoord local_48;
  RtreeCoord p1;
  RtreeCoord c2;
  RtreeCoord c1;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pCheck->rc == 0) {
    uVar9 = (ulong)(uint)iDepth;
    pStmt = pCheck->pGetNode;
    if (pStmt == (sqlite3_stmt *)0x0) {
      pStmt = rtreeCheckPrepare(pCheck,"SELECT data FROM %Q.\'%q_node\' WHERE nodeno=?",pCheck->zDb,
                                pCheck->zTab);
      pCheck->pGetNode = pStmt;
      if (pCheck->rc != 0) goto LAB_001d88f5;
    }
    sqlite3_bind_int64(pStmt,1,iNode);
    iVar4 = sqlite3_step(pCheck->pGetNode);
    if (iVar4 == 100) {
      uVar5 = sqlite3_column_bytes(pCheck->pGetNode,0);
      __src = sqlite3_column_blob(pCheck->pGetNode,0);
      __dest = (ushort *)sqlite3_malloc64((long)(int)uVar5);
      if (__dest == (ushort *)0x0) {
        pCheck->rc = 7;
        goto LAB_001d89c1;
      }
      memcpy(__dest,__src,(long)(int)uVar5);
    }
    else {
LAB_001d89c1:
      uVar5 = 0;
      __dest = (ushort *)0x0;
    }
    rtreeCheckReset(pCheck,pCheck->pGetNode);
    if ((__dest == (ushort *)0x0) && (pCheck->rc == 0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        rtreeCheckAppendMsg(pCheck,"Node %lld missing from database",iNode);
        return;
      }
      goto LAB_001d8cc9;
    }
    if (__dest != (ushort *)0x0) {
      if ((int)uVar5 < 4) {
        rtreeCheckAppendMsg(pCheck,"Node %lld is too small (%d bytes)",iNode,(ulong)uVar5);
      }
      else if ((aParent == (u8 *)0x0) &&
              (uVar3 = *__dest << 8 | *__dest >> 8, uVar9 = (ulong)uVar3, 0x28 < uVar3)) {
        rtreeCheckAppendMsg(pCheck,"Rtree depth out of range (%d)",uVar9);
      }
      else {
        uVar3 = __dest[1] << 8 | __dest[1] >> 8;
        uVar7 = (ulong)uVar3;
        if ((int)uVar5 < (int)((pCheck->nDim * 8 + 8) * (uint)uVar3 | 4)) {
          rtreeCheckAppendMsg(pCheck,"Node %lld is too small for cell count of %d (%d bytes)",iNode,
                              uVar7,(ulong)uVar5);
        }
        else {
          for (uVar5 = 0; uVar5 != (uint)uVar7; uVar5 = uVar5 + 1) {
            iVar4 = pCheck->nDim;
            iVar6 = (iVar4 * 8 + 8) * uVar5;
            lVar8 = (long)(iVar6 + 4);
            iKey = readInt64((u8 *)(lVar8 + (long)__dest));
            c1.i = -1;
            c2.i = -1;
            p1.i = -1;
            local_48.i = -1;
            p = (u8 *)((long)__dest + (long)iVar6 + 0x10);
            p_00 = aParent;
            for (uVar7 = 0; (long)uVar7 < (long)iVar4; uVar7 = uVar7 + 1) {
              readCoord(p + -4,&c1);
              readCoord(p,&c2);
              RVar2 = c1;
              RVar1 = c2;
              if (pCheck->bInt == 0) {
                if (c2.f < c1.f) goto LAB_001d8b92;
              }
              else if (c2.i < c1.i) {
LAB_001d8b92:
                rtreeCheckAppendMsg(pCheck,"Dimension %d of cell %d on node %lld is corrupt",
                                    uVar7 & 0xffffffff,(ulong)uVar5,iNode);
              }
              if (aParent != (u8 *)0x0) {
                readCoord(p_00,&p1);
                readCoord(p_00 + 4,&local_48);
                if (pCheck->bInt == 0) {
                  if ((RVar2.f < p1.f) || (local_48.f < RVar1.f)) goto LAB_001d8c34;
                }
                else if ((RVar2.i < p1.i) || (local_48.i < RVar1.i)) {
LAB_001d8c34:
                  rtreeCheckAppendMsg(pCheck,
                                      "Dimension %d of cell %d on node %lld is corrupt relative to parent"
                                      ,uVar7 & 0xffffffff,(ulong)uVar5,iNode);
                }
              }
              iVar4 = pCheck->nDim;
              p_00 = p_00 + 8;
              p = p + 8;
            }
            if ((int)uVar9 < 1) {
              rtreeCheckMapping(pCheck,1,iKey,iNode);
              pCheck->nLeaf = pCheck->nLeaf + 1;
            }
            else {
              rtreeCheckMapping(pCheck,0,iKey,iNode);
              rtreeCheckNode(pCheck,(int)uVar9 + -1,(u8 *)((long)__dest + lVar8 + 8),iKey);
              pCheck->nNonLeaf = pCheck->nNonLeaf + 1;
            }
            uVar7 = (ulong)(uint)uVar3;
          }
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        sqlite3_free(__dest);
        return;
      }
      goto LAB_001d8cc9;
    }
  }
LAB_001d88f5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001d8cc9:
  __stack_chk_fail();
}

Assistant:

static void rtreeCheckNode(
  RtreeCheck *pCheck,
  int iDepth,                     /* Depth of iNode (0==leaf) */
  u8 *aParent,                    /* Buffer containing parent coords */
  i64 iNode                       /* Node to check */
){
  u8 *aNode = 0;
  int nNode = 0;

  assert( iNode==1 || aParent!=0 );
  assert( pCheck->nDim>0 );

  aNode = rtreeCheckGetNode(pCheck, iNode, &nNode);
  if( aNode ){
    if( nNode<4 ){
      rtreeCheckAppendMsg(pCheck,
          "Node %lld is too small (%d bytes)", iNode, nNode
      );
    }else{
      int nCell;                  /* Number of cells on page */
      int i;                      /* Used to iterate through cells */
      if( aParent==0 ){
        iDepth = readInt16(aNode);
        if( iDepth>RTREE_MAX_DEPTH ){
          rtreeCheckAppendMsg(pCheck, "Rtree depth out of range (%d)", iDepth);
          sqlite3_free(aNode);
          return;
        }
      }
      nCell = readInt16(&aNode[2]);
      if( (4 + nCell*(8 + pCheck->nDim*2*4))>nNode ){
        rtreeCheckAppendMsg(pCheck,
            "Node %lld is too small for cell count of %d (%d bytes)",
            iNode, nCell, nNode
        );
      }else{
        for(i=0; i<nCell; i++){
          u8 *pCell = &aNode[4 + i*(8 + pCheck->nDim*2*4)];
          i64 iVal = readInt64(pCell);
          rtreeCheckCellCoord(pCheck, iNode, i, &pCell[8], aParent);

          if( iDepth>0 ){
            rtreeCheckMapping(pCheck, 0, iVal, iNode);
            rtreeCheckNode(pCheck, iDepth-1, &pCell[8], iVal);
            pCheck->nNonLeaf++;
          }else{
            rtreeCheckMapping(pCheck, 1, iVal, iNode);
            pCheck->nLeaf++;
          }
        }
      }
    }
    sqlite3_free(aNode);
  }
}